

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

string * cxxflags_abi_cxx11_(string *__return_storage_ptr__,bool internal)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  int iVar3;
  mapped_type *pmVar4;
  char *__s;
  long *plVar5;
  size_t sVar6;
  size_type *psVar7;
  undefined7 in_register_00000031;
  long lVar8;
  string cxx_version;
  string compiler;
  undefined1 local_2b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270 [4];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000031,internal) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (cxxflags[abi:cxx11](bool)::flags_abi_cxx11_ == '\0') {
      iVar3 = __cxa_guard_acquire(&cxxflags[abi:cxx11](bool)::flags_abi_cxx11_);
      if (iVar3 != 0) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[7],_const_char_(&)[11],_true>
                  (local_270,(char (*) [7])"msvc14",(char (*) [11])"/std:c++14");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                  (local_270 + 1,(char (*) [8])"clang14",(char (*) [11])"-std=c++1y");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[6],_const_char_(&)[11],_true>
                  (local_270 + 2,(char (*) [6])"gcc14",(char (*) [11])"-std=c++1y");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[7],_const_char_(&)[11],_true>
                  (local_270 + 3,(char (*) [7])"msvc17",(char (*) [11])"/std:c++17");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                  (&local_170,(char (*) [8])"clang17",(char (*) [11])"-std=c++1z");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[6],_const_char_(&)[11],_true>
                  (&local_130,(char (*) [6])"gcc17",(char (*) [11])"-std=c++1z");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[7],_const_char_(&)[15],_true>
                  (&local_f0,(char (*) [7])"msvc20",(char (*) [15])"/std:c++latest");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                  (&local_b0,(char (*) [8])"clang20",(char (*) [11])"-std=c++2a");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[6],_const_char_(&)[11],_true>
                  (&local_70,(char (*) [6])"gcc20",(char (*) [11])"-std=c++2a");
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&cxxflags[abi:cxx11](bool)::flags_abi_cxx11_,local_270,
                   &stack0xffffffffffffffd0,0,&local_2b0,&local_290,&local_2b1);
        lVar8 = 0x200;
        do {
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)((long)&local_270[0].first._M_dataplus._M_p + lVar8));
          lVar8 = lVar8 + -0x40;
        } while (lVar8 != -0x40);
        __cxa_atexit(std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::~unordered_map,&cxxflags[abi:cxx11](bool)::flags_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&cxxflags[abi:cxx11](bool)::flags_abi_cxx11_);
      }
    }
    paVar1 = &local_270[0].first.field_2;
    local_270[0].first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270);
    std::__cxx11::string::_M_replace
              ((ulong)local_270,0,(char *)local_270[0].first._M_string_length,0x1181b1);
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0);
    std::__cxx11::string::_M_replace
              ((ulong)&local_2b0,0,(char *)local_2b0._M_string_length,0x11813b);
    std::operator+(&local_290,&local_270[0].first,&local_2b0);
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&cxxflags[abi:cxx11](bool)::flags_abi_cxx11_,&local_290);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(pmVar4->_M_dataplus)._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270[0].first._M_dataplus._M_p != paVar1) {
      operator_delete(local_270[0].first._M_dataplus._M_p,
                      local_270[0].first.field_2._M_allocated_capacity + 1);
    }
  }
  __s = getenv("CXXFLAGS");
  if (__s != (char *)0x0) {
    sVar2 = __return_storage_ptr__->_M_string_length;
    if (sVar2 == 0) {
      local_270[0].first._M_dataplus._M_p = (pointer)&local_270[0].first.field_2;
      sVar6 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_270,__s,__s + sVar6);
    }
    else {
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0," ","");
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      local_270[0].first._M_dataplus._M_p = (pointer)&local_270[0].first.field_2;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_270[0].first.field_2._0_8_ = *psVar7;
        local_270[0].first.field_2._8_8_ = plVar5[3];
      }
      else {
        local_270[0].first.field_2._0_8_ = *psVar7;
        local_270[0].first._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_270[0].first._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
    }
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_270[0].first._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270[0].first._M_dataplus._M_p != &local_270[0].first.field_2) {
      operator_delete(local_270[0].first._M_dataplus._M_p,
                      local_270[0].first.field_2._M_allocated_capacity + 1);
    }
    if ((sVar2 != 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2)) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cxxflags(bool internal = false) {
  std::string cppflags;

  if (internal) {
    cppflags += "-I../include -I../../include ";  // bjam, cmake
    static std::unordered_map<std::string, std::string> flags = {
        {"msvc14", "/std:c++14"},     {"clang14", "-std=c++1y"}, {"gcc14", "-std=c++1y"},
        {"msvc17", "/std:c++17"},     {"clang17", "-std=c++1z"}, {"gcc17", "-std=c++1z"},
        {"msvc20", "/std:c++latest"}, {"clang20", "-std=c++2a"}, {"gcc20", "-std=c++2a"}};

    std::string compiler = "";
#if defined(__CLANG__)
    compiler = "clang";
#elif defined(__GCC__)
    compiler = "gcc";
#elif defined(__MSVC__)
    compiler = "msvc";
#endif

    std::string cxx_version = "";
#if __cplusplus <= 201402L
    cxx_version = "14";
#elif __cplusplus == 201703L
    cxx_version = "17";
#elif __cplusplus >= 201704L
    cxx_version = "20";
#endif
    cppflags += flags[compiler + cxx_version];
  }

  if (auto flags = std::getenv("CXXFLAGS")) {
    cppflags += cppflags.empty() ? flags : std::string{" "} + flags;
  }

  return cppflags;
}